

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::createBinaryOperator
          (StructuralParser *this,Context *c,Expression *a,Expression *b,Op op)

{
  BinaryOperator *pBVar1;
  Op local_8c;
  CompileMessage local_88;
  CompileMessage local_50;
  
  local_8c = op;
  if ((a->kind & ~unknown) != value) {
    Errors::expectedValueOrEndpoint<>();
    AST::Context::throwError(&(a->super_Statement).super_ASTObject.context,&local_50,false);
  }
  if ((b->kind & ~unknown) == value) {
    pBVar1 = allocate<soul::AST::BinaryOperator,soul::AST::Context_const&,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
                       (this,c,a,b,&local_8c);
    return &pBVar1->super_Expression;
  }
  Errors::expectedValueOrEndpoint<>();
  AST::Context::throwError(&(b->super_Statement).super_ASTObject.context,&local_88,false);
}

Assistant:

AST::Expression& createBinaryOperator (const AST::Context& c, AST::Expression& a, AST::Expression& b, BinaryOp::Op op)
    {
        if (! AST::isPossiblyValue (a))  a.context.throwError (Errors::expectedValueOrEndpoint());
        if (! AST::isPossiblyValue (b))  b.context.throwError (Errors::expectedValueOrEndpoint());

        return allocate<AST::BinaryOperator> (c, a, b, op);
    }